

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

String * kj::_::operator*(String *__return_storage_ptr__,undefined8 *param_2,undefined8 param_3,
                         undefined8 param_4,FixedArray<char,_1UL> *param_5)

{
  CappedArray<char,_5UL> CVar1;
  undefined1 local_21;
  size_t local_20;
  undefined4 local_18;
  char local_14;
  
  CVar1 = tryToCharSequence<unsigned_char,kj::CappedArray<char,5ul>>((uchar *)*param_2);
  local_20 = CVar1.currentSize;
  local_18 = CVar1.content._0_4_;
  local_14 = CVar1.content[4];
  local_21 = *(undefined1 *)(param_2 + 1);
  concat<kj::CappedArray<char,5ul>,kj::StringPtr&,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_20,(CappedArray<char,_5UL> *)(param_2 + 2),
             (StringPtr *)&local_21,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}